

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_kGMAA.cpp
# Opt level: O1

bool __thiscall
GMAA_kGMAA::ConstructAndValuateNextPolicies
          (GMAA_kGMAA *this,PartialPolicyPoolItemInterface_sharedPtr *ppi,
          PartialPolicyPoolInterface_sharedPtr *poolOfNextPolicies,bool *cleanUpPPI)

{
  int *piVar1;
  size_t *psVar2;
  GeneralizedMAAStarPlanner *this_00;
  size_t sVar3;
  QFunctionJAOHInterface *q;
  BGIP_SolverCreatorInterface *pBVar4;
  DecPOMDPDiscreteInterface *pDVar5;
  element_type *peVar6;
  element_type *peVar7;
  bool bVar8;
  int iVar9;
  Index IVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LIndex i;
  BayesianGameForDecPOMDPStage *this_01;
  ostream *poVar11;
  BayesianGameIdenticalPayoffSolver *p;
  uint uVar12;
  ulong uVar13;
  double dVar14;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar15 [16];
  undefined1 extraout_var_01 [56];
  shared_ptr<JPPVValuePair> jpvp;
  shared_ptr<BayesianGameForDecPOMDPStage> bg_ts;
  shared_ptr<BayesianGameIdenticalPayoffSolver> bgips;
  PJPDP_sharedPtr jpolPrevTs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> firstOHtsI;
  PJPDP_sharedPtr jpolTs;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  poolOfNextPoliciesIndices;
  JointPolicyPureVector jpolBG;
  stringstream ss;
  string local_388;
  shared_ptr<BayesianGameForDecPOMDPStage> local_368;
  size_t local_358;
  double local_350;
  shared_ptr<BayesianGameIdenticalPayoffSolver> local_348;
  element_type *local_338;
  shared_count sStack_330;
  double local_328;
  shared_count sStack_320;
  element_type *local_318;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_310;
  double local_2f8;
  shared_count asStack_2f0 [2];
  TimedAlgorithm *local_2e0;
  double local_2d8;
  double local_2d0;
  PartialPolicyPoolInterface_sharedPtr *local_2c8;
  double local_2c0;
  double local_2b8;
  long local_2b0;
  shared_count local_2a8;
  I_PtPDpure_constPtr local_2a0;
  undefined1 local_290 [8];
  shared_count local_288;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_280;
  undefined1 local_250 [152];
  shared_ptr<const_PartialJointPolicyDiscretePure> local_1b8;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  undefined1 auVar16 [64];
  
  *cleanUpPPI = true;
  local_2c8 = poolOfNextPolicies;
  (*ppi->px->_vptr_PartialPolicyPoolItemInterface[2])(&local_338);
  sVar3 = (local_338->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
          _m_depth;
  local_358 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
              super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
              _m_horizon;
  iVar9 = (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
            super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
            _vptr_PlanningUnit[6])(this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_310,CONCAT44(extraout_var,iVar9),(allocator_type *)&local_1b8);
  local_358 = local_358 - 1;
  uVar12 = 0;
  while( true ) {
    iVar9 = (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
              super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
              _vptr_PlanningUnit[6])(this);
    uVar13 = (ulong)uVar12;
    if (CONCAT44(extraout_var_00,iVar9) <= uVar13) break;
    i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                  ((PlanningUnitMADPDiscrete *)this,uVar12,(Index)sVar3);
    IVar10 = Globals::CastLIndexToIndex(i);
    if ((ulong)((long)local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar13) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar13)
      ;
    }
    local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar13] = IVar10;
    uVar12 = uVar12 + 1;
  }
  this_01 = (BayesianGameForDecPOMDPStage *)operator_new(0x150);
  q = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete)._m_qHeuristic;
  local_1b8.px = local_338;
  local_1b8.pn.pi_ = sStack_330.pi_;
  if (sStack_330.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (sStack_330.pi_)->use_count_ = (sStack_330.pi_)->use_count_ + 1;
    UNLOCK();
  }
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
            (this_01,(PlanningUnitDecPOMDPDiscrete *)this,q,&local_1b8);
  boost::shared_ptr<BayesianGameForDecPOMDPStage>::shared_ptr<BayesianGameForDecPOMDPStage>
            (&local_368,this_01);
  boost::detail::shared_count::~shared_count(&local_1b8.pn);
  psVar2 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
            super_GeneralizedMAAStarPlanner._m_bgCounter;
  *psVar2 = *psVar2 + 1;
  iVar9 = std::__cxx11::string::compare
                    ((char *)&(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                              super_GeneralizedMAAStarPlanner._m_bgBaseFilename);
  if (iVar9 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,
                         (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                         super_GeneralizedMAAStarPlanner._m_bgBaseFilename._M_dataplus._M_p,
                         (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                         super_GeneralizedMAAStarPlanner._m_bgBaseFilename._M_string_length);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    peVar7 = local_368.px;
    std::__cxx11::stringbuf::str();
    BayesianGameIdenticalPayoff::Save
              (&peVar7->super_BayesianGameIdenticalPayoff,(string *)local_250);
    if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  local_2d0 = (local_338->super_PartialJointPolicy)._m_pastReward;
  local_2a0.px = (element_type *)&(local_368.px)->super_BayesianGameIdenticalPayoff;
  local_280._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_280._M_impl.super__Rb_tree_header._M_header;
  local_280._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_280._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_280._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_318 = local_368.px;
  if (local_368.px == (element_type *)0x0) {
    local_2a0.px = (element_type *)0x0;
  }
  local_2a0.pn.pi_ = local_368.pn.pi_;
  if (local_368.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_368.pn.pi_)->use_count_ = (local_368.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_280._M_impl.super__Rb_tree_header._M_header._M_right =
       local_280._M_impl.super__Rb_tree_header._M_header._M_left;
  JointPolicyPureVector::JointPolicyPureVector
            ((JointPolicyPureVector *)local_250,&local_2a0,TYPE_INDEX);
  boost::detail::shared_count::~shared_count(&local_2a0.pn);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"GMAA::kGMAA_ts",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  this_00 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
             super_GeneralizedMAAStarPlanner;
  TimedAlgorithm::StartTimer(&this_00->super_TimedAlgorithm,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  pBVar4 = this->_m_newBGIP_Solver;
  local_388._M_dataplus._M_p = (pointer)&(local_368.px)->super_BayesianGameIdenticalPayoff;
  if (local_368.px == (element_type *)0x0) {
    local_388._M_dataplus._M_p = (pointer)0x0;
  }
  local_388._M_string_length = (size_type)local_368.pn.pi_;
  if (local_368.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_368.pn.pi_)->use_count_ = (local_368.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  p = (BayesianGameIdenticalPayoffSolver *)(**(code **)(*(long *)pBVar4 + 0x10))(pBVar4,&local_388);
  auVar16._8_56_ = extraout_var_01;
  auVar16._0_8_ = extraout_XMM1_Qa;
  auVar15 = auVar16._0_16_;
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::
  shared_ptr<BayesianGameIdenticalPayoffSolver>(&local_348,p);
  local_2e0 = &this_00->super_TimedAlgorithm;
  boost::detail::shared_count::~shared_count((shared_count *)&local_388._M_string_length);
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetCBGbounds
            (&this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete,ppi,&local_348);
  (*(local_348.px)->_vptr_BayesianGameIdenticalPayoffSolver[4])();
  (*((local_368.px)->super_BayesianGameForDecPOMDPStageInterface).
    _vptr_BayesianGameForDecPOMDPStageInterface[3])(local_368.px,0);
  if ((this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).super_GeneralizedMAAStarPlanner.
      _m_nrPoliciesToProcess != 0) {
    local_318 = (element_type *)
                &(local_318->super_BayesianGameIdenticalPayoff).
                 super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrTypes;
    auVar15 = vcvtusi2sd_avx512f(auVar15,sVar3);
    local_2d8 = auVar15._0_8_;
    uVar12 = 1;
    do {
      bVar8 = BGIPSolution::IsEmptyJPPV(&(local_348.px)->_m_solution);
      if (bVar8) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Warning, BGIP_Solver only returned ",0x23);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," usable joint policies",0x16);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        break;
      }
      BGIPSolution::GetNextSolutionJPPV(&(local_348.px)->_m_solution);
      local_328 = *(double *)(local_388._M_dataplus._M_p + 0x10);
      sStack_320.pi_ = *(sp_counted_base **)(local_388._M_dataplus._M_p + 0x18);
      if (*(long *)(local_388._M_dataplus._M_p + 0x18) != 0) {
        LOCK();
        piVar1 = (int *)(*(long *)(local_388._M_dataplus._M_p + 0x18) + 8);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      BGIPSolution::PopNextSolutionJPPV(&(local_348.px)->_m_solution);
      (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
        super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
        _vptr_PlanningUnit[0x18])(&local_2b0,this,local_338,local_328,local_318,&local_310);
      local_350 = (double)(**(code **)(*(long *)local_388._M_dataplus._M_p + 0x18))();
      pDVar5 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
               super_PlanningUnitDecPOMDPDiscrete._m_DecPOMDP;
      dVar14 = (double)(**(code **)(*(long *)((long)&pDVar5->field_0x0 +
                                             *(long *)(*(long *)pDVar5 + -0xb0)) + 0x70))
                                 ((long)&pDVar5->field_0x0 + *(long *)(*(long *)pDVar5 + -0xb0));
      local_2b8 = pow(dVar14,local_2d8);
      local_2f8 = local_328;
      asStack_2f0[0].pi_ = sStack_320.pi_;
      if (sStack_320.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (sStack_320.pi_)->use_count_ = (sStack_320.pi_)->use_count_ + 1;
        UNLOCK();
      }
      dVar14 = local_328;
      (*((local_368.px)->super_BayesianGameForDecPOMDPStageInterface).
        _vptr_BayesianGameForDecPOMDPStageInterface[5])(local_368.px,&local_2f8,0);
      local_350 = local_2b8 * local_350;
      bVar8 = sVar3 == local_358;
      local_2c0 = dVar14;
      boost::detail::shared_count::~shared_count(asStack_2f0);
      *(double *)(local_2b0 + 0x38) = local_2d0 + local_2c0;
      peVar6 = local_2c8->px;
      (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
        super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
        _vptr_PlanningUnit[0x16])
                ((ulong)bVar8 * (long)(local_2d0 + local_2c0) +
                 (ulong)!bVar8 * (long)(local_2d0 + local_350),local_290,this,&local_2b0);
      (*peVar6->_vptr_PartialPolicyPoolInterface[8])(peVar6,local_290);
      boost::detail::shared_count::~shared_count(&local_288);
      boost::detail::shared_count::~shared_count(&local_2a8);
      boost::detail::shared_count::~shared_count(&sStack_320);
      boost::detail::shared_count::~shared_count((shared_count *)&local_388._M_string_length);
      uVar13 = (ulong)uVar12;
      uVar12 = uVar12 + 1;
    } while (uVar13 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                      super_GeneralizedMAAStarPlanner._m_nrPoliciesToProcess);
  }
  (*((local_368.px)->super_BayesianGameForDecPOMDPStageInterface).
    _vptr_BayesianGameForDecPOMDPStageInterface[4])();
  std::__cxx11::stringbuf::str();
  TimedAlgorithm::StopTimer(local_2e0,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_348.pn);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  JointPolicyPureVector::~JointPolicyPureVector((JointPolicyPureVector *)local_250);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_280);
  boost::detail::shared_count::~shared_count(&local_368.pn);
  if (local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_310.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  bVar8 = sVar3 == local_358;
  boost::detail::shared_count::~shared_count(&sStack_330);
  return bVar8;
}

Assistant:

bool GMAA_kGMAA::ConstructAndValuateNextPolicies(
        const PartialPolicyPoolItemInterface_sharedPtr &ppi, 
        const PartialPolicyPoolInterface_sharedPtr &poolOfNextPolicies,
        bool &cleanUpPPI)
{
    cleanUpPPI=true;
    PJPDP_sharedPtr jpolPrevTs = ppi->GetJPol();//jpol^ts-1
    size_t ts = jpolPrevTs->GetDepth();     // = depth = ts(jpolPrevTs) + 1
    bool is_last_ts = (ts ==  GetHorizon() - 1);

    vector<Index> firstOHtsI(GetNrAgents());
    for(Index agI=0; agI < GetNrAgents(); agI++)
        firstOHtsI.at(agI) = CastLIndexToIndex(GetFirstObservationHistoryIndex(agI, ts));
    // Construct the bayesian game for this timestep - 
    boost::shared_ptr<BayesianGameForDecPOMDPStage> bg_ts=
        boost::shared_ptr<BayesianGameForDecPOMDPStage>(
        new BayesianGameForDecPOMDPStage(
            this,
            _m_qHeuristic,
            jpolPrevTs
            ));

    _m_bgCounter++;
    if(_m_bgBaseFilename!="")
    {
        stringstream ss;
        ss << _m_bgBaseFilename << _m_bgCounter;
        BayesianGameIdenticalPayoff::Save(*bg_ts,ss.str());
    }

    double prevPastReward = jpolPrevTs->GetPastReward();
    const vector<size_t>& nrOHts = bg_ts->GetNrTypes(); 
    //size_t nrJOHts = bg_ts->GetNrJointTypes(); 

    //The set of Indicies of the policies added to poolOfNextPolicies
    //(to avoid adding duplicates).
    set<Index> poolOfNextPoliciesIndices;

    //the policy for the Bayesian game 
    JointPolicyPureVector jpolBG = JointPolicyPureVector(bg_ts,
            PolicyGlobals::TYPE_INDEX);

    stringstream ss;
    ss << "GMAA::kGMAA_ts" << ts;
    StartTimer(ss.str());
    
    //solve the Bayesian game
    //boost::shared_ptr<
    //BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector> > bgips=
        //boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector> >((*_m_newBGIP_Solver)(bg_ts));
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver> bgips =
        boost::shared_ptr<BayesianGameIdenticalPayoffSolver>(
                _m_newBGIP_Solver->operator()(bg_ts)
                );

    SetCBGbounds(ppi,bgips);
    bgips->Solve();

    //for each solution in BGIPSolution  
    bg_ts->ComputeAllImmediateRewards();
    for(Index solI=0; solI < _m_nrPoliciesToProcess; solI++)
    {
        if(bgips->IsEmptyJPPV())
        {
            cerr << "Warning, BGIP_Solver only returned "<<solI<<
                " usable joint policies"<<endl;
            break;
        }
        const boost::shared_ptr<JPPVValuePair> jpvp = bgips->GetNextSolutionJPPV();
        JPPV_sharedPtr bgpol = jpvp->GetJPPV();

        bgips->PopNextSolutionJPPV();
        PJPDP_sharedPtr jpolTs = 
            ConstructExtendedJointPolicy(*jpolPrevTs,
                                    *bgpol, nrOHts, firstOHtsI);

        double val = jpvp->GetValue();
        double discountToThePowerT = pow( GetDiscount(), (double)(ts) );
        double discounted_F = discountToThePowerT * val;

        //compute expected immediate reward for this stage
        double immR = bg_ts->ComputeDiscountedImmediateRewardForJPol(bgpol);
        double newPastreward = prevPastReward + immR;
        jpolTs->SetPastReward(newPastreward);
        
        ////if last stage, if so, we want to return the 
        ////*EXACT* past reward, newPastreward.
        double newValue;
        if(is_last_ts)
            newValue = newPastreward;
        else
            newValue = prevPastReward + discounted_F;

        //push this policy and value on the priority queue
        poolOfNextPolicies->Insert( NewPPI(jpolTs,newValue) );

        /*//push this policy and value on the priority queue
        ////if last stage, if so, we want to return the 
        ///[>EXACT* past reward, newPastreward.
        if(is_last_ts)
            poolOfNextPolicies->Insert( NewPPI(jpolTs,newPastreward) );
        else // VAL SHOULD BE DISCOUNTED?
            poolOfNextPolicies->Insert( NewPPI(jpolTs,
                                        val + prevPastReward) );*/

    }
    //empty the imm reward cache
    bg_ts->ClearAllImmediateRewards();

    StopTimer(ss.str());
    //if we created a BG for the last time step t=h-1 - we have a lowerbound
    return(is_last_ts);
}